

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImDrawList *
GetViewportBgFgDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImDrawList *this;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = viewport->BgFgDrawLists[drawlist_no];
  if (this == (ImDrawList *)0x0) {
    this = (ImDrawList *)ImGui::MemAlloc(200);
    memset(this,0,0xc0);
    this->_Data = &pIVar3->DrawListSharedData;
    this->_OwnerName = drawlist_name;
    viewport->BgFgDrawLists[drawlist_no] = this;
  }
  if (viewport->BgFgDrawListsLastFrame[drawlist_no] != pIVar3->FrameCount) {
    ImDrawList::_ResetForNewFrame(this);
    ImDrawList::PushTextureID(this,((pIVar3->IO).Fonts)->TexID);
    IVar1 = (viewport->super_ImGuiViewport).Pos;
    IVar2 = (viewport->super_ImGuiViewport).Size;
    local_38.x = IVar2.x + IVar1.x;
    local_38.y = IVar2.y + IVar1.y;
    ImDrawList::PushClipRect(this,&(viewport->super_ImGuiViewport).Pos,&local_38,false);
    viewport->BgFgDrawListsLastFrame[drawlist_no] = pIVar3->FrameCount;
  }
  return this;
}

Assistant:

static ImDrawList* GetViewportBgFgDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->BgFgDrawLists));
    ImDrawList* draw_list = viewport->BgFgDrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->BgFgDrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->BgFgDrawListsLastFrame[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->BgFgDrawListsLastFrame[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}